

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

leaf_t add_container(roaring64_bitmap_t *r,container_t *container,uint8_t typecode)

{
  uint64_t container_index;
  leaf_t lVar1;
  uint8_t in_DL;
  undefined8 in_RSI;
  long in_RDI;
  uint64_t index;
  roaring64_bitmap_t *in_stack_ffffffffffffffe0;
  
  container_index = allocate_index(in_stack_ffffffffffffffe0);
  *(undefined8 *)(*(long *)(in_RDI + 0xb0) + container_index * 8) = in_RSI;
  lVar1 = create_leaf(container_index,in_DL);
  return lVar1;
}

Assistant:

static leaf_t add_container(roaring64_bitmap_t *r, container_t *container,
                            uint8_t typecode) {
    uint64_t index = allocate_index(r);
    r->containers[index] = container;
    return create_leaf(index, typecode);
}